

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall
QHttpThreadDelegate::sslErrorsSlot(QHttpThreadDelegate *this,QList<QSslError> *errors)

{
  long in_FS_OFFSET;
  bool ignoreAll;
  QArrayDataPointer<QSslError> local_48;
  bool local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)&local_48);
    sslConfigurationChanged(this,(QSslConfiguration *)&local_48);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_48);
    local_29 = false;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QSslError *)0x0;
    local_48.size = 0;
    sslErrors(this,errors,&local_29,(QList<QSslError> *)&local_48);
    if (local_29 == true) {
      QHttpNetworkReply::ignoreSslErrors(*(QHttpNetworkReply **)(this + 0x150));
    }
    if (local_48.size != 0) {
      QHttpNetworkReply::ignoreSslErrors
                (*(QHttpNetworkReply **)(this + 0x150),(QList<QSslError> *)&local_48);
    }
    QArrayDataPointer<QSslError>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::sslErrorsSlot(const QList<QSslError> &errors)
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());

    bool ignoreAll = false;
    QList<QSslError> specificErrors;
    emit sslErrors(errors, &ignoreAll, &specificErrors);
    if (ignoreAll)
        httpReply->ignoreSslErrors();
    if (!specificErrors.isEmpty())
        httpReply->ignoreSslErrors(specificErrors);
}